

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selector_table.cc
# Opt level: O1

uint sel_copyTypedSelectors_np(char *selName,SEL *sels,uint count)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  SEL poVar4;
  uint uVar5;
  long *plVar6;
  
  if (selName == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    poVar4 = selector_lookup(selName,(char *)0x0);
    uVar5 = 0;
    if (poVar4 != (SEL)0x0) {
      uVar1 = *(uint *)&poVar4->field_0;
      pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::selector_table_lock);
      lVar2 = *(anonymous_namespace)::selector_list;
      lVar3 = (anonymous_namespace)::selector_list[1];
      pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::selector_table_lock);
      uVar5 = 0;
      if (lVar2 != 0 && (ulong)uVar1 < (ulong)(lVar3 - lVar2 >> 3)) {
        plVar6 = *(long **)(lVar2 + (ulong)uVar1 * 8);
        if (count == 0) {
          uVar5 = 0xffffffff;
          do {
            plVar6 = (long *)*plVar6;
            uVar5 = uVar5 + 1;
          } while (plVar6 != (long *)0x0);
        }
        else {
          for (uVar5 = 0; (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0 && (uVar5 <= count));
              uVar5 = uVar5 + 1) {
            poVar4 = selector_lookup(selName,(char *)plVar6[1]);
            sels[uVar5] = poVar4;
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

unsigned sel_copyTypedSelectors_np(const char *selName, SEL *const sels, unsigned count)
{
	if (nullptr == selName) { return 0; }
	SEL untyped = selector_lookup(selName, 0);
	if (untyped == nullptr) { return 0; }

	auto *l = selLookup(untyped->index);
	if (l == nullptr)
	{
		return 0;
	}

	if (count == 0)
	{
		for (auto type : *l)
		{
			count++;
		}
		return count;
	}

	unsigned found = 0;
	for (auto type : *l)
	{
		if (found > count)
		{
			break;
		}
		sels[found++] = selector_lookup(selName, type);
	}
	return found;
}